

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImVec2 __thiscall ImRect::GetClosestPoint(ImRect *this,ImVec2 p,bool on_edge)

{
  float *pfVar1;
  bool bVar2;
  bool on_edge_local;
  ImRect *this_local;
  ImVec2 p_local;
  
  this_local = (ImRect *)p;
  if ((on_edge) || (bVar2 = Contains(this,(ImVec2 *)&this_local), !bVar2)) {
    if (this_local._0_4_ < (this->Max).x || this_local._0_4_ == (this->Max).x) {
      if (this_local._0_4_ < (this->Min).x) {
        this_local = (ImRect *)CONCAT44(this_local._4_4_,(this->Min).x);
      }
    }
    else {
      this_local = (ImRect *)CONCAT44(this_local._4_4_,(this->Max).x);
    }
    pfVar1 = &(this->Max).y;
    if (this_local._4_4_ < *pfVar1 || this_local._4_4_ == *pfVar1) {
      if (this_local._4_4_ < (this->Min).y) {
        this_local = (ImRect *)CONCAT44((this->Min).y,this_local._0_4_);
      }
    }
    else {
      this_local = (ImRect *)CONCAT44((this->Max).y,this_local._0_4_);
    }
    p_local = (ImVec2)this_local;
  }
  else {
    p_local = (ImVec2)this_local;
  }
  return p_local;
}

Assistant:

ImVec2      GetClosestPoint(ImVec2 p, bool on_edge) const
    {
        if (!on_edge && Contains(p))
            return p;
        if (p.x > Max.x) p.x = Max.x;
        else if (p.x < Min.x) p.x = Min.x;
        if (p.y > Max.y) p.y = Max.y;
        else if (p.y < Min.y) p.y = Min.y;
        return p;
    }